

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,BreakStatement *break_stmt,void *data)

{
  size_t sVar1;
  
  if (break_stmt->loop_ != (SyntaxTree *)0x0) {
    sVar1 = Function::AddInstruction
                      (this->current_function_->function_,(Instruction)0x12000000,
                       (break_stmt->break_).line_);
    AddLoopJumpInfo(this,break_stmt->loop_,(int)sVar1,JumpTail);
    return;
  }
  __assert_fail("break_stmt->loop_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x31b,"virtual void luna::CodeGenerateVisitor::Visit(BreakStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(BreakStatement *break_stmt, void *data)
    {
        assert(break_stmt->loop_);
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, break_stmt->break_.line_);
        AddLoopJumpInfo(break_stmt->loop_, index, LoopJumpInfo::JumpTail);
    }